

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddNaryExtendedInstruction
          (InstructionBuilder *this,uint32_t result_type,uint32_t set,uint32_t instruction,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ext_operands)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  pointer this_00;
  bool bVar1;
  uint32_t res_id;
  reference puVar2;
  IRContext *pIVar3;
  Instruction *this_01;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1c8
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  uint local_1b4;
  uint32_t result_id;
  undefined8 local_1a8;
  SmallVector<unsigned_int,_2UL> local_1a0;
  Operand local_178;
  uint local_144;
  const_iterator cStack_140;
  uint32_t id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  iterator local_120;
  undefined8 local_118;
  SmallVector<unsigned_int,_2UL> local_110;
  Operand local_e8;
  uint32_t local_b4;
  iterator local_b0;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  undefined1 local_48 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ext_operands_local;
  uint32_t instruction_local;
  uint32_t set_local;
  uint32_t result_type_local;
  InstructionBuilder *this_local;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ext_operands;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48);
  local_b0 = &local_b4;
  local_a8 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_b0;
  local_b4 = set;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list_01);
  Operand::Operand(&local_78,SPV_OPERAND_TYPE_ID,&local_a0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48,
             &local_78);
  Operand::~Operand(&local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  local_120 = (iterator)((long)&__range2 + 4);
  local_118 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_120;
  __range2._4_4_ = instruction;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_110,init_list_00);
  Operand::Operand(&local_e8,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_110);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48,
             &local_e8);
  Operand::~Operand(&local_e8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_110);
  this_00 = operands.
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      operands.
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cStack_140 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffec0);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    local_1b4 = *puVar2;
    _result_id = &local_1b4;
    local_1a8 = 1;
    init_list._M_len = 1;
    init_list._M_array = _result_id;
    local_144 = local_1b4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1a0,init_list);
    Operand::Operand(&local_178,SPV_OPERAND_TYPE_ID,&local_1a0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48,
               &local_178);
    Operand::~Operand(&local_178);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1a0);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  pIVar3 = GetContext(this);
  res_id = IRContext::TakeNextId(pIVar3);
  if (res_id == 0) {
    this_local = (InstructionBuilder *)0x0;
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
  }
  else {
    this_01 = (Instruction *)::operator_new(0x70);
    pIVar3 = GetContext(this);
    opt::Instruction::Instruction
              (this_01,pIVar3,OpExtInst,result_type,res_id,(OperandList *)local_48);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_1c8,this_01);
    this_local = (InstructionBuilder *)AddInstruction(this,&local_1c8);
    new_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = 1;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1c8);
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_48);
  return (Instruction *)this_local;
}

Assistant:

Instruction* AddNaryExtendedInstruction(
      uint32_t result_type, uint32_t set, uint32_t instruction,
      const std::vector<uint32_t>& ext_operands) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {set}});
    operands.push_back(
        {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {instruction}});
    for (uint32_t id : ext_operands) {
      operands.push_back({SPV_OPERAND_TYPE_ID, {id}});
    }

    uint32_t result_id = GetContext()->TakeNextId();
    if (result_id == 0) {
      return nullptr;
    }

    std::unique_ptr<Instruction> new_inst(new Instruction(
        GetContext(), spv::Op::OpExtInst, result_type, result_id, operands));
    return AddInstruction(std::move(new_inst));
  }